

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_fma::create_pipeline_int8_x86(InnerProduct_x86_fma *this,Option *opt)

{
  Mat *this_00;
  float fVar1;
  uint uVar2;
  float *pfVar3;
  void *pvVar4;
  int *piVar5;
  Allocator *pAVar6;
  size_t _elemsize;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  int _w;
  int _elempack;
  byte bVar12;
  float fVar13;
  Mat local_78;
  
  uVar2 = (this->super_InnerProduct).num_output;
  uVar10 = (long)(this->super_InnerProduct).weight_data_size / (long)(int)uVar2;
  bVar12 = (uVar2 & 7) == 0 & opt->use_packing_layout;
  _elemsize = 1;
  if (bVar12 != 0) {
    _elemsize = 8;
  }
  this_00 = &(this->super_InnerProduct).weight_data;
  uVar8 = 0;
  _w = (int)uVar10;
  Mat::reshape(&local_78,this_00,_w,uVar2,(Allocator *)0x0);
  _elempack = (int)_elemsize;
  Mat::create(&this->weight_data_tm,_w,(this->super_InnerProduct).num_output / _elempack,_elemsize,
              _elempack,(Allocator *)0x0);
  uVar10 = uVar10 & 0xffffffff;
  if (_w < 1) {
    uVar10 = uVar8;
  }
  for (; (long)((_elempack - 1) + uVar8) < (long)(this->super_InnerProduct).num_output;
      uVar8 = uVar8 + _elemsize) {
    pvVar7 = (void *)((ulong)((uint)uVar8 >> bVar12 * '\x03') * (long)(this->weight_data_tm).w *
                      (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
    for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      for (sVar11 = 0; _elemsize != sVar11; sVar11 = sVar11 + 1) {
        *(undefined1 *)((long)pvVar7 + sVar11) =
             *(undefined1 *)
              ((long)local_78.data + uVar9 + (long)local_78.w * (sVar11 + uVar8) * local_78.elemsize
              );
      }
      pvVar7 = (void *)((long)pvVar7 + sVar11);
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  uVar8 = 0;
  Mat::create(&this->scale_in_data,(this->super_InnerProduct).num_output,4,(Allocator *)0x0);
  uVar2 = (this->super_InnerProduct).num_output;
  pvVar7 = (this->super_InnerProduct).weight_data_int8_scales.data;
  pfVar3 = (float *)(this->super_InnerProduct).bottom_blob_int8_scales.data;
  pvVar4 = (this->scale_in_data).data;
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    fVar1 = *(float *)((long)pvVar7 + uVar8 * 4);
    fVar13 = 0.0;
    if (fVar1 != 0.0) {
      fVar13 = 1.0 / (fVar1 * *pfVar3);
    }
    *(float *)((long)pvVar4 + uVar8 * 4) = fVar13;
  }
  if (opt->lightmode != false) {
    piVar5 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        pAVar6 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar6 == (Allocator *)0x0) {
          free((this->super_InnerProduct).weight_data.data);
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.elemsize + 4) = 0;
    this_00->data = (void *)0x0;
    (this->super_InnerProduct).weight_data.refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline_int8_x86(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_tm.create(num_input, num_output / out_elempack, (size_t)out_elempack, out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g0 = weight_data_tm.row<signed char>(q / out_elempack);

            for (int p = 0; p < num_input; p++)
            {
                for (int j = 0; j < out_elempack; j++)
                {
                    *g0++ = weight_data_r2.row<signed char>(q + j)[p];
                }
            }
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // dequantize
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}